

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O3

size_t HUF_readDTableX1_wksp
                 (HUF_DTable *DTable,void *src,size_t srcSize,void *workSpace,size_t wkspSize,
                 int flags)

{
  undefined1 uVar1;
  uint uVar2;
  U32 UVar3;
  long lVar4;
  ulong uVar5;
  uint uVar6;
  int iVar7;
  long lVar8;
  undefined4 *puVar9;
  long lVar10;
  ulong uVar11;
  uint uVar12;
  ulong uVar13;
  uint uVar14;
  char cVar15;
  long *plVar16;
  int iVar17;
  BYTE *huffWeight;
  undefined1 uVar18;
  int iVar19;
  U32 nbSymbols;
  U32 local_7c;
  long local_78;
  size_t local_70;
  long local_68;
  long local_60;
  HUF_DTable *local_58;
  HUF_DTable *local_50;
  HUF_DTable *local_48;
  ulong local_40;
  ulong local_38;
  
  local_7c = 0;
  nbSymbols = 0;
  local_70 = 0xffffffffffffffd4;
  if (0x5d3 < wkspSize) {
    huffWeight = (BYTE *)((long)workSpace + 0x4d4);
    local_70 = HUF_readStats_wksp(huffWeight,0x100,(U32 *)workSpace,&nbSymbols,&local_7c,src,srcSize
                                  ,(void *)((long)workSpace + 0x68),0x36c,flags);
    UVar3 = nbSymbols;
    if (local_70 < 0xffffffffffffff89) {
      uVar2 = *DTable;
      uVar6 = (uVar2 & 0xff) + 1;
      uVar14 = 0xb;
      if (uVar6 < 0xb) {
        uVar14 = uVar6;
      }
      uVar5 = (ulong)nbSymbols;
      if (local_7c < uVar14 || local_7c - uVar14 == 0) {
        if (local_7c < uVar14) {
          uVar6 = uVar14 - local_7c;
          if (uVar5 != 0) {
            uVar13 = 0;
            do {
              cVar15 = '\0';
              if (huffWeight[uVar13] != '\0') {
                cVar15 = (char)uVar6;
              }
              huffWeight[uVar13] = cVar15 + huffWeight[uVar13];
              uVar13 = uVar13 + 1;
            } while (uVar5 != uVar13);
          }
          if (uVar6 < uVar14) {
            puVar9 = (undefined4 *)((long)workSpace + (ulong)uVar14 * 4);
            uVar12 = uVar14;
            do {
              *puVar9 = *(undefined4 *)((long)workSpace + (ulong)((local_7c - uVar14) + uVar12) * 4)
              ;
              uVar12 = uVar12 - 1;
              puVar9 = puVar9 + -1;
            } while (uVar6 < uVar12);
          }
          memset((void *)((long)workSpace + ((ulong)uVar6 - (ulong)(~local_7c + uVar14)) * 4),0,
                 (ulong)(~local_7c + uVar14) * 4 + 4);
        }
      }
      else {
        uVar14 = local_7c;
        if (uVar6 < local_7c) {
          return 0xffffffffffffffd4;
        }
      }
      *(char *)DTable = (char)uVar2;
      *(undefined1 *)((long)DTable + 1) = 0;
      *(char *)((long)DTable + 2) = (char)uVar14;
      *(char *)((long)DTable + 3) = (char)(uVar2 >> 0x18);
      uVar14 = uVar14 + 1;
      local_38 = (ulong)uVar14;
      uVar13 = 0;
      iVar7 = 0;
      do {
        iVar17 = *(int *)((long)workSpace + uVar13 * 4);
        *(int *)((long)workSpace + uVar13 * 4 + 0x34) = iVar7;
        uVar13 = uVar13 + 1;
        iVar7 = iVar17 + iVar7;
      } while (local_38 != uVar13);
      uVar13 = 0;
      if (3 < (int)UVar3) {
        uVar13 = 0;
        do {
          uVar11 = uVar13 & 0xffffffff;
          lVar10 = 0;
          do {
            uVar2 = *(uint *)((long)workSpace + (ulong)huffWeight[lVar10] * 4 + 0x34);
            *(uint *)((long)workSpace + (ulong)huffWeight[lVar10] * 4 + 0x34) = uVar2 + 1;
            *(char *)((long)workSpace + (ulong)uVar2 + 0x3d4) = (char)uVar11;
            lVar10 = lVar10 + 1;
            uVar11 = (ulong)(byte)((char)uVar11 + 1);
          } while (lVar10 != 4);
          uVar13 = uVar13 + 4;
          huffWeight = huffWeight + 4;
        } while (uVar13 < UVar3 - 3);
      }
      if ((int)uVar13 < (int)UVar3) {
        uVar13 = uVar13 & 0xffffffff;
        do {
          uVar11 = (ulong)*(byte *)((long)workSpace + uVar13 + 0x4d4);
          uVar2 = *(uint *)((long)workSpace + uVar11 * 4 + 0x34);
          *(uint *)((long)workSpace + uVar11 * 4 + 0x34) = uVar2 + 1;
          *(char *)((long)workSpace + (ulong)uVar2 + 0x3d4) = (char)uVar13;
          uVar13 = uVar13 + 1;
        } while (uVar5 != uVar13);
      }
      if (1 < uVar14) {
        iVar7 = *workSpace;
        local_40 = (ulong)uVar14;
        local_50 = DTable + 3;
        local_78 = (long)workSpace + 0x3d4;
        local_58 = DTable + 1;
        local_60 = (long)DTable + 7;
        local_68 = (long)DTable + 5;
        local_48 = DTable + 7;
        iVar17 = 0;
        uVar5 = 1;
        do {
          uVar2 = *(uint *)((long)workSpace + uVar5 * 4);
          uVar13 = (ulong)uVar2;
          iVar19 = (1 << ((byte)uVar5 & 0x1f)) >> 1;
          uVar6 = uVar14 - (int)uVar5;
          uVar18 = (undefined1)uVar6;
          switch(iVar19) {
          case 1:
            if (0 < (int)uVar2) {
              lVar10 = local_68 + (long)iVar17 * 2;
              uVar11 = 0;
              do {
                uVar1 = *(undefined1 *)(iVar7 + local_78 + uVar11);
                *(undefined1 *)(lVar10 + -1 + uVar11 * 2) = uVar18;
                *(undefined1 *)(lVar10 + uVar11 * 2) = uVar1;
                uVar11 = uVar11 + 1;
              } while (uVar13 != uVar11);
            }
            break;
          case 2:
            if (0 < (int)uVar2) {
              lVar10 = local_60 + (long)iVar17 * 2;
              uVar11 = 0;
              do {
                uVar1 = *(undefined1 *)(iVar7 + local_78 + uVar11);
                *(undefined1 *)(lVar10 + -3 + uVar11 * 4) = uVar18;
                *(undefined1 *)(lVar10 + -2 + uVar11 * 4) = uVar1;
                *(undefined1 *)(lVar10 + -1 + uVar11 * 4) = uVar18;
                *(undefined1 *)(lVar10 + uVar11 * 4) = uVar1;
                uVar11 = uVar11 + 1;
              } while (uVar13 != uVar11);
            }
            break;
          default:
            if (0 < (int)uVar2) {
              lVar10 = (long)local_48 + (long)iVar17 * 2;
              uVar11 = 0;
              do {
                if (iVar19 < 1) {
LAB_0018e762:
                  __assert_fail("u == length",
                                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                                ,0x8e17,
                                "size_t HUF_readDTableX1_wksp(HUF_DTable *, const void *, size_t, void *, size_t, int)"
                               );
                }
                lVar8 = ((ulong)*(byte *)((long)workSpace + uVar11 + (long)iVar7 + 0x3d4) << 8 |
                        (ulong)(uVar6 & 0xff)) * 0x1000100010001;
                lVar4 = 0;
                do {
                  *(long *)(lVar10 + -0x18 + lVar4 * 2) = lVar8;
                  *(long *)(lVar10 + -0x10 + lVar4 * 2) = lVar8;
                  *(long *)(lVar10 + -8 + lVar4 * 2) = lVar8;
                  *(long *)(lVar10 + lVar4 * 2) = lVar8;
                  lVar4 = lVar4 + 0x10;
                } while (lVar4 < iVar19);
                if (iVar19 != (int)lVar4) goto LAB_0018e762;
                uVar11 = uVar11 + 1;
                lVar10 = lVar10 + (long)iVar19 * 2;
              } while (uVar11 != uVar13);
            }
            break;
          case 4:
            if (0 < (int)uVar2) {
              uVar11 = 0;
              do {
                *(ulong *)((long)local_58 + uVar11 * 8 + (long)iVar17 * 2) =
                     ((ulong)*(byte *)(iVar7 + local_78 + uVar11) << 8 | (ulong)(uVar6 & 0xff)) *
                     0x1000100010001;
                uVar11 = uVar11 + 1;
              } while (uVar13 != uVar11);
            }
            break;
          case 8:
            if (0 < (int)uVar2) {
              plVar16 = (long *)((long)local_50 + (long)iVar17 * 2);
              uVar11 = 0;
              do {
                lVar10 = ((ulong)*(byte *)(iVar7 + local_78 + uVar11) << 8 | (ulong)(uVar6 & 0xff))
                         * 0x1000100010001;
                plVar16[-1] = lVar10;
                *plVar16 = lVar10;
                uVar11 = uVar11 + 1;
                plVar16 = plVar16 + 2;
              } while (uVar13 != uVar11);
            }
          }
          iVar7 = iVar7 + uVar2;
          iVar17 = iVar17 + iVar19 * uVar2;
          uVar5 = uVar5 + 1;
        } while (uVar5 != local_40);
      }
    }
  }
  return local_70;
}

Assistant:

size_t HUF_readDTableX1_wksp(HUF_DTable* DTable, const void* src, size_t srcSize, void* workSpace, size_t wkspSize, int flags)
{
    U32 tableLog = 0;
    U32 nbSymbols = 0;
    size_t iSize;
    void* const dtPtr = DTable + 1;
    HUF_DEltX1* const dt = (HUF_DEltX1*)dtPtr;
    HUF_ReadDTableX1_Workspace* wksp = (HUF_ReadDTableX1_Workspace*)workSpace;

    DEBUG_STATIC_ASSERT(HUF_DECOMPRESS_WORKSPACE_SIZE >= sizeof(*wksp));
    if (sizeof(*wksp) > wkspSize) return ERROR(tableLog_tooLarge);

    DEBUG_STATIC_ASSERT(sizeof(DTableDesc) == sizeof(HUF_DTable));
    /* ZSTD_memset(huffWeight, 0, sizeof(huffWeight)); */   /* is not necessary, even though some analyzer complain ... */

    iSize = HUF_readStats_wksp(wksp->huffWeight, HUF_SYMBOLVALUE_MAX + 1, wksp->rankVal, &nbSymbols, &tableLog, src, srcSize, wksp->statsWksp, sizeof(wksp->statsWksp), flags);
    if (HUF_isError(iSize)) return iSize;


    /* Table header */
    {   DTableDesc dtd = HUF_getDTableDesc(DTable);
        U32 const maxTableLog = dtd.maxTableLog + 1;
        U32 const targetTableLog = MIN(maxTableLog, HUF_DECODER_FAST_TABLELOG);
        tableLog = HUF_rescaleStats(wksp->huffWeight, wksp->rankVal, nbSymbols, tableLog, targetTableLog);
        if (tableLog > (U32)(dtd.maxTableLog+1)) return ERROR(tableLog_tooLarge);   /* DTable too small, Huffman tree cannot fit in */
        dtd.tableType = 0;
        dtd.tableLog = (BYTE)tableLog;
        ZSTD_memcpy(DTable, &dtd, sizeof(dtd));
    }

    /* Compute symbols and rankStart given rankVal:
     *
     * rankVal already contains the number of values of each weight.
     *
     * symbols contains the symbols ordered by weight. First are the rankVal[0]
     * weight 0 symbols, followed by the rankVal[1] weight 1 symbols, and so on.
     * symbols[0] is filled (but unused) to avoid a branch.
     *
     * rankStart contains the offset where each rank belongs in the DTable.
     * rankStart[0] is not filled because there are no entries in the table for
     * weight 0.
     */
    {   int n;
        U32 nextRankStart = 0;
        int const unroll = 4;
        int const nLimit = (int)nbSymbols - unroll + 1;
        for (n=0; n<(int)tableLog+1; n++) {
            U32 const curr = nextRankStart;
            nextRankStart += wksp->rankVal[n];
            wksp->rankStart[n] = curr;
        }
        for (n=0; n < nLimit; n += unroll) {
            int u;
            for (u=0; u < unroll; ++u) {
                size_t const w = wksp->huffWeight[n+u];
                wksp->symbols[wksp->rankStart[w]++] = (BYTE)(n+u);
            }
        }
        for (; n < (int)nbSymbols; ++n) {
            size_t const w = wksp->huffWeight[n];
            wksp->symbols[wksp->rankStart[w]++] = (BYTE)n;
        }
    }

    /* fill DTable
     * We fill all entries of each weight in order.
     * That way length is a constant for each iteration of the outer loop.
     * We can switch based on the length to a different inner loop which is
     * optimized for that particular case.
     */
    {   U32 w;
        int symbol = wksp->rankVal[0];
        int rankStart = 0;
        for (w=1; w<tableLog+1; ++w) {
            int const symbolCount = wksp->rankVal[w];
            int const length = (1 << w) >> 1;
            int uStart = rankStart;
            BYTE const nbBits = (BYTE)(tableLog + 1 - w);
            int s;
            int u;
            switch (length) {
            case 1:
                for (s=0; s<symbolCount; ++s) {
                    HUF_DEltX1 D;
                    D.byte = wksp->symbols[symbol + s];
                    D.nbBits = nbBits;
                    dt[uStart] = D;
                    uStart += 1;
                }
                break;
            case 2:
                for (s=0; s<symbolCount; ++s) {
                    HUF_DEltX1 D;
                    D.byte = wksp->symbols[symbol + s];
                    D.nbBits = nbBits;
                    dt[uStart+0] = D;
                    dt[uStart+1] = D;
                    uStart += 2;
                }
                break;
            case 4:
                for (s=0; s<symbolCount; ++s) {
                    U64 const D4 = HUF_DEltX1_set4(wksp->symbols[symbol + s], nbBits);
                    MEM_write64(dt + uStart, D4);
                    uStart += 4;
                }
                break;
            case 8:
                for (s=0; s<symbolCount; ++s) {
                    U64 const D4 = HUF_DEltX1_set4(wksp->symbols[symbol + s], nbBits);
                    MEM_write64(dt + uStart, D4);
                    MEM_write64(dt + uStart + 4, D4);
                    uStart += 8;
                }
                break;
            default:
                for (s=0; s<symbolCount; ++s) {
                    U64 const D4 = HUF_DEltX1_set4(wksp->symbols[symbol + s], nbBits);
                    for (u=0; u < length; u += 16) {
                        MEM_write64(dt + uStart + u + 0, D4);
                        MEM_write64(dt + uStart + u + 4, D4);
                        MEM_write64(dt + uStart + u + 8, D4);
                        MEM_write64(dt + uStart + u + 12, D4);
                    }
                    assert(u == length);
                    uStart += length;
                }
                break;
            }
            symbol += symbolCount;
            rankStart += symbolCount * length;
        }
    }
    return iSize;
}